

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O0

void __thiscall UtilityTest_PtrConst_Test::TestBody(UtilityTest_PtrConst_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  ulong uVar3;
  size_type sVar4;
  AssertionResult gtest_ar_1;
  vector<char,_std::allocator<char>_> emptyVector;
  AssertionResult gtest_ar;
  int i;
  double *ptrDouble;
  vector<double,_std::allocator<double>_> vDouble;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  allocator_type *in_stack_ffffffffffffff18;
  Secret *pSVar5;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  int line;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  Type TVar6;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_60;
  int local_4c;
  AssertHelper *local_48;
  undefined8 local_28;
  vector<double,_std::allocator<double>_> local_20;
  
  local_28 = 0x3ff4cccccccccccd;
  std::allocator<double>::allocator((allocator<double> *)0x22f703);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             (size_type)in_stack_ffffffffffffff28,(value_type *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  std::allocator<double>::~allocator((allocator<double> *)0x22f731);
  this_00 = (AssertHelper *)
            pica::ptr<double>((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff08);
  local_4c = 0;
  local_48 = this_00;
  while( true ) {
    uVar3 = (ulong)local_4c;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_20);
    if (sVar4 <= uVar3) break;
    std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)local_4c);
    TVar6 = (Type)(uVar3 >> 0x20);
    testing::internal::EqHelper<false>::Compare<double,double>
              (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
               (double *)in_stack_ffffffffffffff18,
               (double *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    in_stack_ffffffffffffff37 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_ffffffffffffff28 =
           testing::AssertionResult::failure_message((AssertionResult *)0x22f867);
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar6,(char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)
                 ,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(char *)in_stack_ffffffffffffff20)
      ;
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68.ptr_);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      testing::Message::~Message((Message *)0x22f8c4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x22f92f);
    if (!bVar1) goto LAB_0022fae4;
    local_4c = local_4c + 1;
  }
  pSVar5 = (Secret *)&stack0xffffffffffffff70;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x22f979);
  TVar6 = (Type)(uVar3 >> 0x20);
  in_stack_ffffffffffffff20 =
       (vector<char,_std::allocator<char>_> *)pica::ptr<char>(in_stack_ffffffffffffff08);
  testing::internal::EqHelper<true>::Compare<char_const>
            (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,pSVar5,
             (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  line = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff60);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x22fa14);
    testing::internal::AssertHelper::AssertHelper
              (this_00,TVar6,(char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               line,(char *)in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff10));
    testing::Message::~Message((Message *)0x22fa60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22fac2);
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff20);
LAB_0022fae4:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20);
  return;
}

Assistant:

TEST(UtilityTest, PtrConst) {
    const vector<double> vDouble(5, 1.3);
    const double* ptrDouble = ptr(vDouble);
    for (int i = 0; i < vDouble.size(); i++)
        ASSERT_EQ(vDouble[i], ptrDouble[i]);
    const vector<char> emptyVector;
    ASSERT_EQ(NULL, ptr(emptyVector));
}